

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Locker.cpp
# Opt level: O2

void Handlers::Locker_Open(Character *character,PacketReader *reader)

{
  uint uVar1;
  byte x;
  byte y;
  TileSpec TVar2;
  uint uVar3;
  uint uVar4;
  _List_node_base *p_Var5;
  PacketBuilder reply;
  
  x = PacketReader::GetChar(reader);
  y = PacketReader::GetChar(reader);
  uVar3 = (uint)character->x - (uint)x;
  uVar1 = -uVar3;
  if (0 < (int)uVar3) {
    uVar1 = uVar3;
  }
  uVar4 = (uint)character->y - (uint)y;
  uVar3 = -uVar4;
  if (0 < (int)uVar4) {
    uVar3 = uVar4;
  }
  if ((uVar3 & 0xff) + (uVar1 & 0xff) < 2) {
    TVar2 = Map::GetSpec(character->map,x,y);
    if (TVar2 == BankVault) {
      PacketBuilder::PacketBuilder
                (&reply,PACKET_LOCKER,PACKET_OPEN,
                 (character->bank).super__List_base<Character_Item,_std::allocator<Character_Item>_>
                 ._M_impl._M_node._M_size * 5 + 2);
      PacketBuilder::AddChar(&reply,x);
      PacketBuilder::AddChar(&reply,y);
      p_Var5 = (_List_node_base *)&character->bank;
      while (p_Var5 = (((_List_base<Character_Item,_std::allocator<Character_Item>_> *)
                       &p_Var5->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
            p_Var5 != (_List_node_base *)&character->bank) {
        uVar1 = *(uint *)((long)&p_Var5[1]._M_next + 4);
        PacketBuilder::AddShort(&reply,*(unsigned_short *)&p_Var5[1]._M_next);
        PacketBuilder::AddThree(&reply,uVar1);
      }
      Character::Send(character,&reply);
      PacketBuilder::~PacketBuilder(&reply);
    }
  }
  return;
}

Assistant:

void Locker_Open(Character *character, PacketReader &reader)
{
	unsigned char x = reader.GetChar();
	unsigned char y = reader.GetChar();

	if (util::path_length(character->x, character->y, x, y) <= 1)
	{
		if (character->map->GetSpec(x, y) == Map_Tile::BankVault)
		{
			PacketBuilder reply(PACKET_LOCKER, PACKET_OPEN, 2 + character->bank.size() * 5);
			reply.AddChar(x);
			reply.AddChar(y);
			UTIL_FOREACH(character->bank, item)
			{
				reply.AddShort(item.id);
				reply.AddThree(item.amount);
			}
			character->Send(reply);
		}
	}
}